

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadednormalizer2impl.cpp
# Opt level: O0

UBool icu_63::uprv_loaded_normalizer2_cleanup(void)

{
  Norm2AllModes *pNVar1;
  void *in_RSI;
  
  pNVar1 = nfkcSingleton;
  if (nfkcSingleton != (Norm2AllModes *)0x0) {
    Norm2AllModes::~Norm2AllModes(nfkcSingleton);
    UMemory::operator_delete((UMemory *)pNVar1,in_RSI);
  }
  nfkcSingleton = (Norm2AllModes *)0x0;
  UInitOnce::reset((UInitOnce *)&nfkcInitOnce);
  pNVar1 = nfkc_cfSingleton;
  if (nfkc_cfSingleton != (Norm2AllModes *)0x0) {
    Norm2AllModes::~Norm2AllModes(nfkc_cfSingleton);
    UMemory::operator_delete((UMemory *)pNVar1,in_RSI);
  }
  nfkc_cfSingleton = (Norm2AllModes *)0x0;
  UInitOnce::reset((UInitOnce *)&nfkc_cfInitOnce);
  uhash_close_63(cache);
  cache = (UHashtable *)0x0;
  return '\x01';
}

Assistant:

static UBool U_CALLCONV uprv_loaded_normalizer2_cleanup() {
#if !NORM2_HARDCODE_NFC_DATA
    delete nfcSingleton;
    nfcSingleton = NULL;
    nfcInitOnce.reset();
#endif

    delete nfkcSingleton;
    nfkcSingleton = NULL;
    nfkcInitOnce.reset();

    delete nfkc_cfSingleton;
    nfkc_cfSingleton = NULL;
    nfkc_cfInitOnce.reset();

    uhash_close(cache);
    cache=NULL;
    return TRUE;
}